

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate_stream.cpp
# Opt level: O0

void __thiscall
boost::deflate::inflate_stream_test::Matrix::operator()(Matrix *this,Boost *f,string *check)

{
  int window_00;
  string *this_00;
  int in_stack_ffffffffffffff60;
  undefined1 local_60 [16];
  string local_50;
  int local_2c;
  int local_28;
  int strategy;
  int window;
  int level;
  string *check_local;
  Boost *f_local;
  Matrix *this_local;
  
  _window = (internal_state *)check;
  check_local = (string *)f;
  f_local = (Boost *)this;
  for (strategy = this->level_[0]; strategy <= this->level_[1]; strategy = strategy + 1) {
    for (local_28 = this->window_[0]; local_28 <= this->window_[1]; local_28 = local_28 + 1) {
      for (local_2c = this->strategy_[0]; this_00 = check_local, window_00 = local_28,
          local_2c <= this->strategy_[1]; local_2c = local_2c + 1) {
        basic_string_view<char,std::char_traits<char>>::basic_string_view<std::allocator<char>>
                  ((basic_string_view<char,std::char_traits<char>> *)local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_window);
        compress_abi_cxx11_((string *)(local_60 + 0x10),(inflate_stream_test *)local_60,
                            (string_view *)(ulong)(uint)strategy,local_28,0,4,local_2c,
                            in_stack_ffffffffffffff60);
        Boost::operator()((Boost *)this_00,window_00,(string *)(local_60 + 0x10),(string *)_window);
        std::__cxx11::string::~string((string *)(local_60 + 0x10));
      }
    }
  }
  return;
}

Assistant:

void operator()(
            F const& f,
            std::string const& check) const
        {
            for(auto level = level_[0];
                level <= level_[1]; ++level)
            {
                for(auto window = window_[0];
                    window <= window_[1]; ++window)
                {
                    for(auto strategy = strategy_[0];
                        strategy <= strategy_[1]; ++strategy)
                        f(
                            window,
                            compress(check, level, window,boost::deflate::wrap::none, 4, strategy),
                            check);
                }
            }
        }